

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

color_quad_i16 crnlib::etc1_block::unpack_delta3(uint16 packed_delta3)

{
  anon_union_8_3_dd316fa8_for_color_quad<short,_int>_3 in_RDI;
  int b;
  int g;
  int r;
  
  color_quad<short,_int>::color_quad
            ((color_quad<short,_int> *)in_RDI,in_RDI._4_4_,in_RDI.m_u32,0,0x21cdc5);
  return (color_quad_i16)in_RDI;
}

Assistant:

color_quad_i16 etc1_block::unpack_delta3(uint16 packed_delta3) {
  int r = (packed_delta3 >> 6) & 7;
  int g = (packed_delta3 >> 3) & 7;
  int b = packed_delta3 & 7;
  if (r >= 4)
    r -= 8;
  if (g >= 4)
    g -= 8;
  if (b >= 4)
    b -= 8;
  return color_quad_i16(r, g, b, 0);
}